

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMax
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  pointer pBVar5;
  pointer pBVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  undefined4 *puVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  uint *puVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  undefined4 *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  long in_FS_OFFSET;
  bool bVar14;
  byte bVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_408 [32];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [13];
  undefined3 uStack_39b;
  int iStack_398;
  bool bStack_394;
  undefined8 local_390;
  int *local_388;
  int *local_380;
  cpp_dec_float<200U,_int,_void> *local_378;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  undefined1 local_368 [32];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [13];
  undefined3 uStack_2fb;
  int iStack_2f8;
  bool bStack_2f4;
  undefined8 local_2f0;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [13];
  undefined3 uStack_27b;
  int iStack_278;
  bool bStack_274;
  undefined8 local_270;
  Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
  *local_268;
  int *local_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [13];
  undefined3 uStack_1eb;
  int iStack_1e8;
  bool bStack_1e4;
  undefined8 local_1e0;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [13];
  undefined3 uStack_16b;
  int iStack_168;
  bool bStack_164;
  undefined8 local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [13];
  undefined3 uStack_eb;
  int iStack_e8;
  bool bStack_e4;
  undefined8 local_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar15 = 0;
  local_160._0_4_ = cpp_dec_float_finite;
  local_160._4_4_ = 0x1c;
  local_1d8._0_16_ = (undefined1  [16])0x0;
  local_1d8._16_16_ = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = SUB1613((undefined1  [16])0x0,0);
  uStack_16b = 0;
  iStack_168 = 0;
  bStack_164 = false;
  local_270._0_4_ = cpp_dec_float_finite;
  local_270._4_4_ = 0x1c;
  local_2e8._0_16_ = (undefined1  [16])0x0;
  local_2e8._16_16_ = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = SUB1613((undefined1  [16])0x0,0);
  uStack_27b = 0;
  iStack_278 = 0;
  bStack_274 = false;
  local_380 = minIdx;
  if (*nBp == 0) {
    ::soplex::infinity::__tls_init();
    local_390._0_4_ = cpp_dec_float_finite;
    local_390._4_4_ = 0x1c;
    local_408._0_16_ = (undefined1  [16])0x0;
    local_408._16_16_ = (undefined1  [16])0x0;
    local_3e8 = (undefined1  [16])0x0;
    local_3d8 = (undefined1  [16])0x0;
    local_3c8 = (undefined1  [16])0x0;
    local_3b8 = (undefined1  [16])0x0;
    local_3a8 = SUB1613((undefined1  [16])0x0,0);
    uStack_39b = 0;
    iStack_398 = 0;
    bStack_394 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_408,*(double *)(in_FS_OFFSET + -8));
  }
  else {
    iVar3 = *minIdx;
    pBVar5 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar6 = pBVar5 + iVar3;
    puVar8 = (undefined4 *)local_408;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar8 = *(undefined4 *)&(pBVar6->val).m_backend;
      pBVar6 = (pointer)((long)&(pBVar6->val).m_backend + 4);
      puVar8 = puVar8 + 1;
    }
    iStack_398 = *(int *)((long)&pBVar5[iVar3].val.m_backend + 0x70);
    bStack_394 = *(bool *)((long)&pBVar5[iVar3].val.m_backend + 0x74);
    local_390 = *(undefined8 *)((long)&pBVar5[iVar3].val.m_backend + 0x78);
  }
  puVar8 = (undefined4 *)local_408;
  puVar12 = (undefined4 *)local_1d8;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar12 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar15 * -2 + 1;
    puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
  }
  iStack_168 = iStack_398;
  bStack_164 = bStack_394;
  local_160._0_4_ = (fpclass_type)local_390;
  local_160._4_4_ = local_390._4_4_;
  if (0 < nnz) {
    local_260 = idx + nnz;
    local_370 = &(this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).epsilon;
    local_c8 = *(double *)(in_FS_OFFSET + -8);
    local_378 = &(this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend;
    uStack_c0 = 0;
    local_d8 = -local_c8;
    uStack_d0 = 0x8000000000000000;
    local_268 = &this->breakpoints;
    do {
      iVar3 = *idx;
      pnVar7 = upd + iVar3;
      pcVar9 = &local_b0;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pcVar9->data)._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
        pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar7 + ((ulong)bVar15 * -2 + 1) * 4);
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar15 * -8 + 4);
      }
      local_b0.exp = upd[iVar3].m_backend.exp;
      local_b0.neg = upd[iVar3].m_backend.neg;
      uVar1._0_4_ = upd[iVar3].m_backend.fpclass;
      uVar1._4_4_ = upd[iVar3].m_backend.prec_elem;
      pnVar7 = local_370;
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)local_408;
      local_b0._120_8_ = uVar1;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pcVar9->data)._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
        pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar7 + (ulong)bVar15 * -8 + 4);
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar15 * -8 + 4);
      }
      iStack_398 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).epsilon.m_backend.exp;
      bStack_394 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).epsilon.m_backend.neg;
      local_390._0_4_ =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.fpclass;
      local_390._4_4_ =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.prec_elem;
      if (((fpclass_type)local_390 == cpp_dec_float_NaN || (fpclass_type)uVar1 == cpp_dec_float_NaN)
         || (iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_b0,(cpp_dec_float<200U,_int,_void> *)local_408), iVar2 < 1))
      {
        pnVar7 = local_370;
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)local_408;
        for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pcVar9->data)._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
          pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar7 + (ulong)bVar15 * -8 + 4);
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar15 * -8 + 4);
        }
        iStack_398 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).epsilon.m_backend.exp;
        bStack_394 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).epsilon.m_backend.neg;
        local_390._0_4_ =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.fpclass;
        local_390._4_4_ =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.prec_elem;
        if (local_408._0_4_ != 0 || (fpclass_type)local_390 != cpp_dec_float_finite) {
          bStack_394 = (bool)(bStack_394 ^ 1);
        }
        if ((((fpclass_type)local_390 != cpp_dec_float_NaN) &&
            (local_b0.fpclass != cpp_dec_float_NaN)) &&
           (iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_b0,(cpp_dec_float<200U,_int,_void> *)local_408), iVar2 < 0)) {
          ::soplex::infinity::__tls_init();
          pcVar9 = &low[iVar3].m_backend;
          local_390._0_4_ = cpp_dec_float_finite;
          local_390._4_4_ = 0x1c;
          local_408._0_16_ = (undefined1  [16])0x0;
          local_408._16_16_ = (undefined1  [16])0x0;
          local_3e8 = (undefined1  [16])0x0;
          local_3d8 = (undefined1  [16])0x0;
          local_3c8 = (undefined1  [16])0x0;
          local_3b8 = (undefined1  [16])0x0;
          local_3a8 = SUB1613((undefined1  [16])0x0,0);
          uStack_39b = 0;
          iStack_398 = 0;
          bStack_394 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_408,local_d8);
          if ((pcVar9->fpclass != cpp_dec_float_NaN) &&
             ((fpclass_type)local_390 != cpp_dec_float_NaN)) {
            local_388 = (int *)CONCAT44(local_388._4_4_,iVar3);
            iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar9,(cpp_dec_float<200U,_int,_void> *)local_408);
            if (0 < iVar2) {
              local_2f0._0_4_ = cpp_dec_float_finite;
              local_2f0._4_4_ = 0x1c;
              local_368._0_16_ = (undefined1  [16])0x0;
              local_368._16_16_ = (undefined1  [16])0x0;
              local_348 = (undefined1  [16])0x0;
              local_338 = (undefined1  [16])0x0;
              local_328 = (undefined1  [16])0x0;
              local_318 = (undefined1  [16])0x0;
              local_308 = SUB1613((undefined1  [16])0x0,0);
              uStack_2fb = 0;
              iStack_2f8 = 0;
              bStack_2f4 = false;
              if ((cpp_dec_float<200U,_int,_void> *)local_368 == &vec[iVar3].m_backend) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_368,pcVar9);
                if (local_368._0_4_ != 0 || (fpclass_type)local_2f0 != cpp_dec_float_finite) {
                  bStack_2f4 = (bool)(bStack_2f4 ^ 1);
                }
              }
              else {
                if ((cpp_dec_float<200U,_int,_void> *)local_368 != pcVar9) {
                  pcVar11 = pcVar9;
                  pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_368;
                  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
                    (pcVar13->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                    pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar11 + (ulong)bVar15 * -8 + 4);
                    pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar13 + (ulong)bVar15 * -8 + 4);
                  }
                  iStack_2f8 = pcVar9->exp;
                  bStack_2f4 = pcVar9->neg;
                  local_2f0._0_4_ = pcVar9->fpclass;
                  local_2f0._4_4_ = pcVar9->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_368,&vec[iVar3].m_backend);
              }
              pcVar9 = local_378;
              if ((fpclass_type)local_2f0 == cpp_dec_float_NaN) {
LAB_005d3e03:
                local_e0._0_4_ = cpp_dec_float_finite;
                local_e0._4_4_ = 0x1c;
                local_158 = (undefined1  [16])0x0;
                local_148 = (undefined1  [16])0x0;
                local_138 = (undefined1  [16])0x0;
                local_128 = (undefined1  [16])0x0;
                local_118 = (undefined1  [16])0x0;
                local_108 = (undefined1  [16])0x0;
                local_f8 = SUB1613((undefined1  [16])0x0,0);
                uStack_eb = 0;
                iStack_e8 = 0;
                bStack_e4 = false;
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_158;
                if (pcVar11 == pcVar9) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (pcVar11,(cpp_dec_float<200U,_int,_void> *)local_368);
                  if (local_158._0_4_ != 0 || (fpclass_type)local_e0 != cpp_dec_float_finite) {
                    bStack_e4 = (bool)(bStack_e4 ^ 1);
                    pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_158;
                  }
                }
                else {
                  puVar10 = (uint *)local_368;
                  pcVar13 = pcVar11;
                  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
                    (pcVar13->data)._M_elems[0] = *puVar10;
                    puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
                    pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar13 + (ulong)bVar15 * -8 + 4);
                  }
                  iStack_e8 = iStack_2f8;
                  bStack_e4 = bStack_2f4;
                  local_e0._0_4_ = (fpclass_type)local_2f0;
                  local_e0._4_4_ = local_2f0._4_4_;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (pcVar11,pcVar9);
                }
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_408,0,(type *)0x0);
                iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_368,
                                   (cpp_dec_float<200U,_int,_void> *)local_408);
                if (iVar3 < 0) goto LAB_005d3e03;
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_258;
                pcVar13 = pcVar11;
                for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
                  (pcVar13->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
                  pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar15 * -8 + 4)
                  ;
                  pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar13 + (ulong)bVar15 * -8 + 4);
                }
                iStack_1e8 = (this->
                             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).fastDelta.m_backend.exp;
                bStack_1e4 = (this->
                             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).fastDelta.m_backend.neg;
                local_1e0._0_4_ =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.fpclass;
                local_1e0._4_4_ =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.prec_elem;
                if ((fpclass_type)local_1e0 != cpp_dec_float_finite || local_258._0_4_ != 0) {
                  bStack_1e4 = (bool)(bStack_1e4 ^ 1);
                  pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_258;
                }
              }
              local_390._0_4_ = cpp_dec_float_finite;
              local_390._4_4_ = 0x1c;
              local_408._0_16_ = (undefined1  [16])0x0;
              local_408._16_16_ = (undefined1  [16])0x0;
              local_3e8 = (undefined1  [16])0x0;
              local_3d8 = (undefined1  [16])0x0;
              local_3c8 = (undefined1  [16])0x0;
              local_3b8 = (undefined1  [16])0x0;
              local_3a8 = SUB1613((undefined1  [16])0x0,0);
              uStack_39b = 0;
              iStack_398 = 0;
              bStack_394 = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)local_408,pcVar11,&local_b0);
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)local_408;
              puVar10 = (uint *)local_2e8;
              for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
                *puVar10 = (pcVar9->data)._M_elems[0];
                pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar15 * -8 + 4);
                puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
              }
              iStack_278 = iStack_398;
              bStack_274 = bStack_394;
              local_270._0_4_ = (fpclass_type)local_390;
              local_270._4_4_ = local_390._4_4_;
              pBVar5 = (this->breakpoints).data.
                       super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pBVar5[*nBp].idx = (int)local_388;
              goto LAB_005d3fb7;
            }
          }
        }
      }
      else {
        ::soplex::infinity::__tls_init();
        pcVar9 = &upp[iVar3].m_backend;
        local_390._0_4_ = cpp_dec_float_finite;
        local_390._4_4_ = 0x1c;
        local_408._0_16_ = (undefined1  [16])0x0;
        local_408._16_16_ = (undefined1  [16])0x0;
        local_3e8 = (undefined1  [16])0x0;
        local_3d8 = (undefined1  [16])0x0;
        local_3c8 = (undefined1  [16])0x0;
        local_3b8 = (undefined1  [16])0x0;
        local_3a8 = SUB1613((undefined1  [16])0x0,0);
        uStack_39b = 0;
        iStack_398 = 0;
        bStack_394 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_408,local_c8);
        if (((pcVar9->fpclass == cpp_dec_float_NaN) ||
            ((fpclass_type)local_390 == cpp_dec_float_NaN)) ||
           (local_388 = idx,
           iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (pcVar9,(cpp_dec_float<200U,_int,_void> *)local_408), idx = local_388,
           -1 < iVar2)) goto LAB_005d4091;
        local_2f0._0_4_ = cpp_dec_float_finite;
        local_2f0._4_4_ = 0x1c;
        local_368._0_16_ = (undefined1  [16])0x0;
        local_368._16_16_ = (undefined1  [16])0x0;
        local_348 = (undefined1  [16])0x0;
        local_338 = (undefined1  [16])0x0;
        local_328 = (undefined1  [16])0x0;
        local_318 = (undefined1  [16])0x0;
        local_308 = SUB1613((undefined1  [16])0x0,0);
        uStack_2fb = 0;
        iStack_2f8 = 0;
        bStack_2f4 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_368 == &vec[iVar3].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_368,pcVar9);
          if (local_368._0_4_ != 0 || (fpclass_type)local_2f0 != cpp_dec_float_finite) {
            bStack_2f4 = (bool)(bStack_2f4 ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<200U,_int,_void> *)local_368 != pcVar9) {
            pcVar11 = pcVar9;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_368;
            for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
              (pcVar13->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar15 * -8 + 4);
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar15 * -8 + 4);
            }
            iStack_2f8 = pcVar9->exp;
            bStack_2f4 = pcVar9->neg;
            local_2f0._0_4_ = pcVar9->fpclass;
            local_2f0._4_4_ = pcVar9->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_368,&vec[iVar3].m_backend);
        }
        pcVar9 = local_378;
        if ((fpclass_type)local_2f0 == cpp_dec_float_NaN) {
LAB_005d3bb7:
          local_1e0._0_4_ = cpp_dec_float_finite;
          local_1e0._4_4_ = 0x1c;
          local_258 = (undefined1  [16])0x0;
          local_248 = (undefined1  [16])0x0;
          local_238 = (undefined1  [16])0x0;
          local_228 = (undefined1  [16])0x0;
          local_218 = (undefined1  [16])0x0;
          local_208 = (undefined1  [16])0x0;
          local_1f8 = SUB1613((undefined1  [16])0x0,0);
          uStack_1eb = 0;
          iStack_1e8 = 0;
          bStack_1e4 = false;
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_368;
          if ((cpp_dec_float<200U,_int,_void> *)local_258 != pcVar9) {
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_258;
            for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
              (pcVar13->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar15 * -8 + 4);
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar15 * -8 + 4);
            }
            iStack_1e8 = iStack_2f8;
            bStack_1e4 = bStack_2f4;
            local_1e0._0_4_ = (fpclass_type)local_2f0;
            local_1e0._4_4_ = local_2f0._4_4_;
            pcVar11 = pcVar9;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_258,pcVar11);
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)local_258;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_408,0,(type *)0x0);
          iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_368,
                             (cpp_dec_float<200U,_int,_void> *)local_408);
          if (0 < iVar2) goto LAB_005d3bb7;
        }
        local_390._0_4_ = cpp_dec_float_finite;
        local_390._4_4_ = 0x1c;
        local_408._0_16_ = (undefined1  [16])0x0;
        local_408._16_16_ = (undefined1  [16])0x0;
        local_3e8 = (undefined1  [16])0x0;
        local_3d8 = (undefined1  [16])0x0;
        local_3c8 = (undefined1  [16])0x0;
        local_3b8 = (undefined1  [16])0x0;
        local_3a8 = SUB1613((undefined1  [16])0x0,0);
        uStack_39b = 0;
        iStack_398 = 0;
        bStack_394 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_408,pcVar9,&local_b0);
        puVar8 = (undefined4 *)local_408;
        puVar12 = (undefined4 *)local_2e8;
        for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar12 = *puVar8;
          puVar8 = puVar8 + (ulong)bVar15 * -2 + 1;
          puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
        }
        iStack_278 = iStack_398;
        bStack_274 = bStack_394;
        local_270._0_4_ = (fpclass_type)local_390;
        local_270._4_4_ = local_390._4_4_;
        pBVar5 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar5[*nBp].idx = iVar3;
LAB_005d3fb7:
        iVar3 = *nBp;
        pBVar5[iVar3].src = src;
        puVar8 = (undefined4 *)local_2e8;
        pBVar6 = pBVar5 + iVar3;
        for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
          *(undefined4 *)&(pBVar6->val).m_backend = *puVar8;
          puVar8 = puVar8 + (ulong)bVar15 * -2 + 1;
          pBVar6 = (pointer)((long)pBVar6 + ((ulong)bVar15 * -2 + 1) * 4);
        }
        *(int *)((long)&pBVar5[iVar3].val.m_backend + 0x70) = iStack_398;
        *(bool *)((long)&pBVar5[iVar3].val.m_backend + 0x74) = bStack_394;
        *(undefined8 *)((long)&pBVar5[iVar3].val.m_backend + 0x78) = local_390;
        local_270._0_4_ = (fpclass_type)local_390;
        bVar14 = (fpclass_type)local_270 != cpp_dec_float_NaN;
        iStack_278 = iStack_398;
        bStack_274 = bStack_394;
        local_270 = local_390;
        if (((bVar14) && ((fpclass_type)local_160 != cpp_dec_float_NaN)) &&
           (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                               (cpp_dec_float<200U,_int,_void> *)local_1d8), iVar3 < 0)) {
          puVar8 = (undefined4 *)local_2e8;
          puVar12 = (undefined4 *)local_1d8;
          for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
            *puVar12 = *puVar8;
            puVar8 = puVar8 + (ulong)bVar15 * -2 + 1;
            puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
          }
          iStack_168 = iStack_278;
          bStack_164 = bStack_274;
          local_160._0_4_ = (fpclass_type)local_270;
          local_160._4_4_ = local_270._4_4_;
          *local_380 = *nBp;
        }
        *nBp = *nBp + 1;
      }
LAB_005d4091:
      iVar3 = *nBp;
      iVar2 = (int)((ulong)((long)(this->breakpoints).data.
                                  super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->breakpoints).data.
                                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (SBORROW4(iVar3,iVar2 * -0xf0f0f0f) == iVar3 + iVar2 * 0xf0f0f0f < 0) {
        std::
        vector<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
        ::resize(&local_268->data,(long)iVar3 * 2);
      }
      idx = idx + 1;
    } while (idx < local_260);
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMax(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? this->fastDelta / x : (y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];
            curVal = (y >= 0) ? -this->fastDelta / x : (y - this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}